

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall
cmake::Build(cmake *this,string *dir,string *target,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmState *pcVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  cmGlobalGenerator *this_00;
  ostream *poVar10;
  string local_f8;
  string output;
  string cachePath;
  string projName;
  string local_50;
  
  paVar1 = &cachePath.field_2;
  cachePath._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cachePath,"");
  cmState::SetSourceDirectory(this->State,&cachePath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cachePath._M_dataplus._M_p != paVar1) {
    operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
  }
  cachePath._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cachePath,"");
  cmState::SetBinaryDirectory(this->State,&cachePath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cachePath._M_dataplus._M_p != paVar1) {
    operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
  }
  bVar6 = cmsys::SystemTools::FileIsDirectory(dir);
  if (bVar6) {
    pcVar3 = (dir->_M_dataplus)._M_p;
    cachePath._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cachePath,pcVar3,pcVar3 + dir->_M_string_length);
    cmsys::SystemTools::ConvertToUnixSlashes(&cachePath);
    bVar6 = cmCacheManager::LoadCache(this->CacheManager,&cachePath);
    if (bVar6) {
      pcVar4 = this->State;
      paVar2 = &output.field_2;
      output._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&output,"CMAKE_GENERATOR","");
      pcVar8 = cmState::GetCacheEntryValue(pcVar4,&output);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)output._M_dataplus._M_p != paVar2) {
        operator_delete(output._M_dataplus._M_p,
                        CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                 output.field_2._M_local_buf[0]) + 1);
      }
      if (pcVar8 == (char *)0x0) {
        iVar7 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n",0x2f);
      }
      else {
        output._M_dataplus._M_p = (pointer)paVar2;
        sVar9 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&output,pcVar8,pcVar8 + sVar9);
        this_00 = CreateGlobalGenerator(this,&output);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)output._M_dataplus._M_p != paVar2) {
          operator_delete(output._M_dataplus._M_p,
                          CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                   output.field_2._M_local_buf[0]) + 1);
        }
        if (this_00 == (cmGlobalGenerator *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"",0x25);
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
          iVar7 = 1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"\n",2);
        }
        else {
          output._M_string_length = 0;
          output.field_2._M_local_buf[0] = '\0';
          projName._M_dataplus._M_p = (pointer)&projName.field_2;
          projName._M_string_length = 0;
          projName.field_2._M_local_buf[0] = '\0';
          pcVar4 = this->State;
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          output._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,"CMAKE_PROJECT_NAME","");
          pcVar8 = cmState::GetCacheEntryValue(pcVar4,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          sVar5 = projName._M_string_length;
          if (pcVar8 == (char *)0x0) {
            iVar7 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n",
                       0x32);
          }
          else {
            strlen(pcVar8);
            std::__cxx11::string::_M_replace((ulong)&projName,0,(char *)sVar5,(ulong)pcVar8);
            pcVar4 = this->State;
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f8,"CMAKE_VERBOSE_MAKEFILE","");
            pcVar8 = cmState::GetCacheEntryValue(pcVar4,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (pcVar8 == (char *)0x0) {
              bVar6 = false;
            }
            else {
              bVar6 = cmSystemTools::IsOn(pcVar8);
            }
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
            iVar7 = cmGlobalGenerator::Build
                              (this_00,&local_f8,dir,&projName,target,&output,&local_50,config,clean
                               ,false,bVar6,0.0,OUTPUT_PASSTHROUGH,nativeOptions);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)projName._M_dataplus._M_p != &projName.field_2) {
            operator_delete(projName._M_dataplus._M_p,
                            CONCAT71(projName.field_2._M_allocated_capacity._1_7_,
                                     projName.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)output._M_dataplus._M_p != &output.field_2) {
            operator_delete(output._M_dataplus._M_p,
                            CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                     output.field_2._M_local_buf[0]) + 1);
          }
          (*this_00->_vptr_cmGlobalGenerator[1])(this_00);
        }
      }
    }
    else {
      iVar7 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: could not load cache\n",0x1c);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cachePath._M_dataplus._M_p != paVar1) {
      operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not a directory\n",0x14);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int cmake::Build(const std::string& dir,
                 const std::string& target,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions,
                 bool clean)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if(!cmSystemTools::FileIsDirectory(dir))
    {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
    }
  std::string cachePath = dir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  if(!this->LoadCache(cachePath))
    {
    std::cerr << "Error: could not load cache\n";
    return 1;
    }
  const char* cachedGenerator =
      this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if(!cachedGenerator)
    {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
    }
  cmsys::auto_ptr<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(cachedGenerator));
  if(!gen.get())
    {
    std::cerr << "Error: could create CMAKE_GENERATOR \""
              << cachedGenerator << "\"\n";
    return 1;
    }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
      this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if(!cachedProjectName)
    {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
    }
  projName = cachedProjectName;
  bool verbose = false;
  const char* cachedVerbose =
      this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if(cachedVerbose)
    {
    verbose = cmSystemTools::IsOn(cachedVerbose);
    }
  return gen->Build("", dir,
                    projName, target,
                    output,
                    "",
                    config, clean, false, verbose, 0,
                    cmSystemTools::OUTPUT_PASSTHROUGH,
                    nativeOptions);
}